

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O1

char * read_string(char **memory,size_t *length)

{
  ushort uVar1;
  char *__ptr;
  int *piVar2;
  ulong uVar3;
  ushort *__src;
  ulong __n;
  
  uVar3 = *length;
  if (1 < uVar3) {
    uVar1 = *(ushort *)*memory;
    __src = (ushort *)((long)*memory + 2);
    *memory = (char *)__src;
    uVar3 = uVar3 - 2;
    *length = uVar3;
    uVar1 = uVar1 << 8 | uVar1 >> 8;
    if (uVar1 <= uVar3 && -1 < (short)uVar1) {
      __n = (ulong)(short)uVar1;
      __ptr = (char *)malloc(__n + 1);
      if (__ptr != (char *)0x0) {
        if (__n <= uVar3) {
          memcpy(__ptr,__src,__n);
          *memory = (char *)((long)__src + __n);
          *length = uVar3 - __n;
          __ptr[__n] = '\0';
          return __ptr;
        }
        goto LAB_0010399b;
      }
      piVar2 = __errno_location();
      *piVar2 = -2;
    }
  }
  __ptr = (char *)0x0;
LAB_0010399b:
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    *piVar2 = -1;
  }
  free(__ptr);
  return (char *)0x0;
}

Assistant:

static char* read_string(const char** memory, size_t* length)
{
    int16_t string_length;
    char* ret = NULL;

    READ_GENERIC(&string_length, sizeof string_length, swapped_memscan, goto parse_error);

    if(string_length < 0)               goto parse_error;
    if(*length < (size_t)string_length) goto parse_error;

    CHECKED_MALLOC(ret, string_length + 1, goto parse_error);

    READ_GENERIC(ret, (size_t)string_length, memscan, goto parse_error);

    ret[string_length] = '\0'; /* don't forget to NULL-terminate ;) */
    return ret;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;

    free(ret);
    return NULL;
}